

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_to_n32_unsafe.cc
# Opt level: O2

bool s_to_i32_unsafe(char *s,char *s_end,int32_t *number)

{
  long lVar1;
  char *pcVar2;
  
  if (*s == '-') {
    pcVar2 = s + 1;
    lVar1 = 0;
    do {
      if (pcVar2 == s_end) {
LAB_0014d66c:
        *number = (int32_t)lVar1;
        return true;
      }
      lVar1 = (lVar1 * 10 - (long)*pcVar2) + 0x30;
      pcVar2 = pcVar2 + 1;
    } while (-0x80000001 < lVar1);
  }
  else {
    lVar1 = 0;
    do {
      if (s == s_end) goto LAB_0014d66c;
      lVar1 = lVar1 * 10 + (long)*s + -0x30;
      s = s + 1;
    } while (lVar1 < 0x80000000);
  }
  return false;
}

Assistant:

bool s_to_i32_unsafe (const char * s, const char * s_end, int32_t & number)
{
	int64_t i = 0;
	if (*s == '-')
	{
		++s;
		for (; s != s_end; ++s)
		{
			i *= 10;
			i -= *s - 0x30;
			if (i < std::numeric_limits<int32_t>::min())
			{
				return false;
			}
		}
	}
	else
	{
		for (; s != s_end; ++s)
		{
			i *= 10;
			i += *s - 0x30;
			if (i > std::numeric_limits<int32_t>::max())
			{
				return false;
			}
		}
	}
	number = static_cast<int32_t> (i);
	return true;
}